

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive.cpp
# Opt level: O2

string * __thiscall
ArchiveMemberHeader::getName_abi_cxx11_(string *__return_storage_ptr__,ArchiveMemberHeader *this)

{
  int __c;
  uint8_t *puVar1;
  uint8_t *puVar2;
  
  __c = 0x2f;
  if (this->fileName[0] == '/') {
    __c = 0x20;
  }
  puVar1 = (uint8_t *)memchr(this,__c,0x10);
  puVar2 = this->timestamp;
  if (puVar1 != (uint8_t *)0x0) {
    puVar2 = puVar1;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,this,puVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string ArchiveMemberHeader::getName() const {
  char endChar;
  if (fileName[0] == '/') {
    // Special name (string table or reference, or symbol table)
    endChar = ' ';
  } else {
    endChar = '/'; // regular name
  }
  auto* end =
    static_cast<const uint8_t*>(memchr(fileName, endChar, sizeof(fileName)));
  if (!end) {
    end = fileName + sizeof(fileName);
  }
  return std::string((char*)(fileName), end - fileName);
}